

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.hpp
# Opt level: O1

string * __thiscall
cinatra::cookie::to_string_abi_cxx11_(string *__return_storage_ptr__,cookie *this)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  time_t tVar5;
  size_type __n;
  ulong uVar6;
  char *in_R8;
  uint __len;
  seconds s;
  ulong __val;
  char (*buf) [32];
  char *__s;
  long *in_FS_OFFSET;
  string_view sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  cinatra *this_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,0x100);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"=");
  if (this->version_ == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,(this->value_)._M_dataplus._M_p,
               (this->value_)._M_string_length);
    if ((this->domain_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; domain=");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(this->domain_)._M_dataplus._M_p,
                 (this->domain_)._M_string_length);
    }
    if ((this->path_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; path=");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(this->path_)._M_dataplus._M_p,
                 (this->path_)._M_string_length);
    }
    if ((this->priority_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Priority=");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(this->priority_)._M_dataplus._M_p,
                 (this->priority_)._M_string_length);
    }
    if (this->max_age_ != -1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; expires=");
      lVar2 = this->max_age_;
      tVar5 = time((time_t *)0x0);
      buf = (char (*) [32])(tVar5 + lVar2);
      this_00 = (cinatra *)(*in_FS_OFFSET + -0x60);
      if ((char (*) [32])in_FS_OFFSET[-8] == buf) {
        __n = in_FS_OFFSET[-7];
      }
      else {
        sVar7._M_str = in_R8;
        sVar7._M_len = (size_t)"%a, %d %b %Y %H:%M:%S";
        sVar7 = get_local_time_str<0ul,32ul>(this_00,buf,0x15,sVar7);
        this_00 = (cinatra *)sVar7._M_str;
        *(undefined4 *)((long)in_FS_OFFSET + (sVar7._M_len - 0x60)) = 0x544d4720;
        __n = sVar7._M_len + 4;
        in_FS_OFFSET[-7] = __n;
        in_FS_OFFSET[-8] = (long)buf;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,(char *)this_00,__n);
    }
    if (this->secure_ == true) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; secure");
    }
    if (this->http_only_ == false) {
      return __return_storage_ptr__;
    }
    __s = "; HttpOnly";
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,(this->value_)._M_dataplus._M_p,
               (this->value_)._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"");
    if ((this->comment_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Comment=\"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(this->comment_)._M_dataplus._M_p,
                 (this->comment_)._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\"");
    }
    if ((this->domain_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Domain=\"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(this->domain_)._M_dataplus._M_p,
                 (this->domain_)._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\"");
    }
    if ((this->path_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Path=\"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(this->path_)._M_dataplus._M_p,
                 (this->path_)._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\"");
    }
    if ((this->priority_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Priority=\"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(this->priority_)._M_dataplus._M_p,
                 (this->priority_)._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\"");
    }
    if (this->max_age_ != -1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Max-Age=\"");
      uVar1 = this->max_age_;
      __val = -uVar1;
      if (0 < (long)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar6 = __val;
        uVar4 = 4;
        do {
          __len = uVar4;
          if (uVar6 < 100) {
            __len = __len - 2;
            goto LAB_0015aac8;
          }
          if (uVar6 < 1000) {
            __len = __len - 1;
            goto LAB_0015aac8;
          }
          if (uVar6 < 10000) goto LAB_0015aac8;
          bVar3 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          uVar4 = __len + 4;
        } while (bVar3);
        __len = __len + 1;
      }
LAB_0015aac8:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_50,(ulong)(__len - (int)((long)uVar1 >> 0x3f)),'-');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_50._M_dataplus._M_p + -((long)uVar1 >> 0x3f),__len,__val);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\"");
    }
    if (this->secure_ == true) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; secure");
    }
    __s = "; Version=\"1\"";
    if (this->http_only_ == true) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; HttpOnly");
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,__s);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const {
    std::string result;
    result.reserve(256);
    result.append(name_);
    result.append("=");
    if (version_ == 0) {
      // Netscape cookie
      result.append(value_);
      if (!domain_.empty()) {
        result.append("; domain=");
        result.append(domain_);
      }
      if (!path_.empty()) {
        result.append("; path=");
        result.append(path_);
      }
      if (!priority_.empty()) {
        result.append("; Priority=");
        result.append(priority_);
      }
      if (max_age_ != -1) {
        result.append("; expires=");
        result.append(get_gmt_time_str(std::chrono::system_clock::from_time_t(
            max_age_ + std::time(nullptr))));
      }
      if (secure_) {
        result.append("; secure");
      }
      if (http_only_) {
        result.append("; HttpOnly");
      }
    }
    else {
      // RFC 2109 cookie
      result.append("\"");
      result.append(value_);
      result.append("\"");
      if (!comment_.empty()) {
        result.append("; Comment=\"");
        result.append(comment_);
        result.append("\"");
      }
      if (!domain_.empty()) {
        result.append("; Domain=\"");
        result.append(domain_);
        result.append("\"");
      }
      if (!path_.empty()) {
        result.append("; Path=\"");
        result.append(path_);
        result.append("\"");
      }
      if (!priority_.empty()) {
        result.append("; Priority=\"");
        result.append(priority_);
        result.append("\"");
      }

      if (max_age_ != -1) {
        result.append("; Max-Age=\"");
        result.append(std::to_string(max_age_));
        result.append("\"");
      }
      if (secure_) {
        result.append("; secure");
      }
      if (http_only_) {
        result.append("; HttpOnly");
      }
      result.append("; Version=\"1\"");
    }
    return result;
  }